

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O1

void __thiscall Inferences::CompositeGIE::detach(CompositeGIE *this)

{
  GIList *pGVar1;
  
  for (pGVar1 = this->_inners; pGVar1 != (GIList *)0x0; pGVar1 = pGVar1->_tail) {
    (*(pGVar1->_head->super_SimplifyingGeneratingInference).super_InferenceEngine.
      _vptr_InferenceEngine[3])();
  }
  (this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.super_InferenceEngine
  ._salg = (SaturationAlgorithm *)0x0;
  return;
}

Assistant:

void CompositeGIE::detach()
{
  GIList* eit=_inners;
  while(eit) {
    eit->head()->detach();
    eit=eit->tail();
  }
  GeneratingInferenceEngine::detach();
}